

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_sse42.cc
# Opt level: O0

uint32_t crc32c::ExtendSse42(uint32_t crc,uint8_t *data,size_t size)

{
  long lVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_RDX;
  uint8_t *in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  int i_2;
  uint64_t l642_2;
  uint64_t l641_2;
  int i_1;
  uint64_t l642_1;
  uint64_t l641_1;
  int i;
  uint64_t l642;
  uint64_t l641;
  uint64_t l64;
  uint8_t *x;
  uint32_t l;
  uint8_t *e;
  uint8_t *p;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  uint8_t *in_stack_fffffffffffffc60;
  int local_29c;
  ulong local_298;
  ulong local_290;
  int local_284;
  ulong local_280;
  ulong local_278;
  int local_26c;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  uint local_244;
  uint8_t *local_238;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = in_RSI + in_RDX;
  local_244 = in_EDI ^ 0xffffffff;
  puVar3 = RoundUp<8>((uint8_t *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  local_238 = in_RSI;
  if (puVar3 <= puVar2) {
    while (local_238 != puVar3) {
      local_244 = crc32(local_244,*local_238);
      local_238 = local_238 + 1;
    }
  }
  local_258 = (ulong)local_244;
  for (; 0x3fbf < (long)puVar2 - (long)local_238; local_238 = local_238 + 0x2a80) {
    local_260 = 0;
    local_268 = 0;
    for (local_26c = 0; local_26c < 0x1540; local_26c = local_26c + 0x40) {
      RequestPrefetch((uint8_t *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      RequestPrefetch((uint8_t *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      RequestPrefetch((uint8_t *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar5 = crc32(local_258,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar6 = crc32(local_260,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar7 = crc32(local_268,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar5 = crc32(uVar5,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar6 = crc32(uVar6,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar7 = crc32(uVar7,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar5 = crc32(uVar5,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar6 = crc32(uVar6,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar7 = crc32(uVar7,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar5 = crc32(uVar5,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar6 = crc32(uVar6,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar7 = crc32(uVar7,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar5 = crc32(uVar5,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar6 = crc32(uVar6,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar7 = crc32(uVar7,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar5 = crc32(uVar5,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar6 = crc32(uVar6,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar7 = crc32(uVar7,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar5 = crc32(uVar5,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar6 = crc32(uVar6,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      uVar7 = crc32(uVar7,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_258 = crc32(uVar5,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_260 = crc32(uVar6,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_268 = crc32(uVar7,uVar4);
      local_238 = local_238 + 0x40;
    }
    local_260 = local_260 ^
                (*(uint *)((anonymous_namespace)::kBlock0SkipTable + (local_258 & 0xf) * 4) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_258 >> 4 & 0xf) * 4 + 0x40) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_258 >> 8 & 0xf) * 4 + 0x80) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_258 >> 0xc & 0xf) * 4 + 0xc0) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_258 >> 0x10 & 0xf) * 4 + 0x100) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_258 >> 0x14 & 0xf) * 4 + 0x140) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_258 >> 0x18 & 0xf) * 4 + 0x180) ^
                *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                         (local_258 >> 0x1c & 0xf) * 4 + 0x1c0));
    local_258 = local_268 ^
                (*(uint *)((anonymous_namespace)::kBlock0SkipTable + (local_260 & 0xf) * 4) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_260 >> 4 & 0xf) * 4 + 0x40) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_260 >> 8 & 0xf) * 4 + 0x80) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_260 >> 0xc & 0xf) * 4 + 0xc0) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_260 >> 0x10 & 0xf) * 4 + 0x100) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_260 >> 0x14 & 0xf) * 4 + 0x140) ^
                 *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                          (local_260 >> 0x18 & 0xf) * 4 + 0x180) ^
                *(uint *)((anonymous_namespace)::kBlock0SkipTable +
                         (local_260 >> 0x1c & 0xf) * 4 + 0x1c0));
  }
  for (; 0xfef < (long)puVar2 - (long)local_238; local_238 = local_238 + 0xaa0) {
    local_278 = 0;
    local_280 = 0;
    for (local_284 = 0; local_284 < 0x550; local_284 = local_284 + 8) {
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_258 = crc32(local_258,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_278 = crc32(local_278,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_280 = crc32(local_280,uVar4);
      local_238 = local_238 + 8;
    }
    local_278 = local_278 ^
                (*(uint *)((anonymous_namespace)::kBlock1SkipTable + (local_258 & 0xf) * 4) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_258 >> 4 & 0xf) * 4 + 0x40) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_258 >> 8 & 0xf) * 4 + 0x80) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_258 >> 0xc & 0xf) * 4 + 0xc0) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_258 >> 0x10 & 0xf) * 4 + 0x100) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_258 >> 0x14 & 0xf) * 4 + 0x140) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_258 >> 0x18 & 0xf) * 4 + 0x180) ^
                *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                         (local_258 >> 0x1c & 0xf) * 4 + 0x1c0));
    local_258 = local_280 ^
                (*(uint *)((anonymous_namespace)::kBlock1SkipTable + (local_278 & 0xf) * 4) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_278 >> 4 & 0xf) * 4 + 0x40) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_278 >> 8 & 0xf) * 4 + 0x80) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_278 >> 0xc & 0xf) * 4 + 0xc0) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_278 >> 0x10 & 0xf) * 4 + 0x100) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_278 >> 0x14 & 0xf) * 4 + 0x140) ^
                 *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                          (local_278 >> 0x18 & 0xf) * 4 + 0x180) ^
                *(uint *)((anonymous_namespace)::kBlock1SkipTable +
                         (local_278 >> 0x1c & 0xf) * 4 + 0x1c0));
  }
  for (; 0x3ef < (long)puVar2 - (long)local_238; local_238 = local_238 + 0x2a0) {
    local_290 = 0;
    local_298 = 0;
    for (local_29c = 0; local_29c < 0x150; local_29c = local_29c + 8) {
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_258 = crc32(local_258,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_290 = crc32(local_290,uVar4);
      uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
      local_298 = crc32(local_298,uVar4);
      local_238 = local_238 + 8;
    }
    local_290 = local_290 ^
                (*(uint *)((anonymous_namespace)::kBlock2SkipTable + (local_258 & 0xf) * 4) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_258 >> 4 & 0xf) * 4 + 0x40) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_258 >> 8 & 0xf) * 4 + 0x80) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_258 >> 0xc & 0xf) * 4 + 0xc0) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_258 >> 0x10 & 0xf) * 4 + 0x100) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_258 >> 0x14 & 0xf) * 4 + 0x140) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_258 >> 0x18 & 0xf) * 4 + 0x180) ^
                *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                         (local_258 >> 0x1c & 0xf) * 4 + 0x1c0));
    local_258 = local_298 ^
                (*(uint *)((anonymous_namespace)::kBlock2SkipTable + (local_290 & 0xf) * 4) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_290 >> 4 & 0xf) * 4 + 0x40) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_290 >> 8 & 0xf) * 4 + 0x80) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_290 >> 0xc & 0xf) * 4 + 0xc0) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_290 >> 0x10 & 0xf) * 4 + 0x100) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_290 >> 0x14 & 0xf) * 4 + 0x140) ^
                 *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                          (local_290 >> 0x18 & 0xf) * 4 + 0x180) ^
                *(uint *)((anonymous_namespace)::kBlock2SkipTable +
                         (local_290 >> 0x1c & 0xf) * 4 + 0x1c0));
  }
  for (; 0xf < (long)puVar2 - (long)local_238; local_238 = local_238 + 0x10) {
    uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc60 = (uint8_t *)crc32(local_258,uVar4);
    uVar4 = ReadUint64LE(in_stack_fffffffffffffc60);
    local_258 = crc32(in_stack_fffffffffffffc60,uVar4);
  }
  local_244 = (uint)local_258;
  while (local_238 != puVar2) {
    local_244 = crc32(local_244,*local_238);
    local_238 = local_238 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return ~local_244;
}

Assistant:

uint32_t ExtendSse42(uint32_t crc, const uint8_t* data, size_t size) {
  const uint8_t* p = data;
  const uint8_t* e = data + size;
  uint32_t l = crc ^ kCRC32Xor;

#define STEP1                  \
  do {                         \
    l = _mm_crc32_u8(l, *p++); \
  } while (0)

#define STEP4(crc)                             \
  do {                                         \
    crc = _mm_crc32_u32(crc, ReadUint32LE(p)); \
    p += 4;                                    \
  } while (0)

#define STEP8(crc, data)                          \
  do {                                            \
    crc = _mm_crc32_u64(crc, ReadUint64LE(data)); \
    data += 8;                                    \
  } while (0)

#define STEP8BY3(crc0, crc1, crc2, p0, p1, p2) \
  do {                                         \
    STEP8(crc0, p0);                           \
    STEP8(crc1, p1);                           \
    STEP8(crc2, p2);                           \
  } while (0)

#define STEP8X3(crc0, crc1, crc2, bs)                     \
  do {                                                    \
    crc0 = _mm_crc32_u64(crc0, ReadUint64LE(p));          \
    crc1 = _mm_crc32_u64(crc1, ReadUint64LE(p + bs));     \
    crc2 = _mm_crc32_u64(crc2, ReadUint64LE(p + 2 * bs)); \
    p += 8;                                               \
  } while (0)

#define SKIP_BLOCK(crc, tab)                                      \
  do {                                                            \
    crc = tab[0][crc & 0xf] ^ tab[1][(crc >> 4) & 0xf] ^          \
          tab[2][(crc >> 8) & 0xf] ^ tab[3][(crc >> 12) & 0xf] ^  \
          tab[4][(crc >> 16) & 0xf] ^ tab[5][(crc >> 20) & 0xf] ^ \
          tab[6][(crc >> 24) & 0xf] ^ tab[7][(crc >> 28) & 0xf];  \
  } while (0)

  // Point x at first 8-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<8>(p);
  if (x <= e) {
    // Process bytes p is 8-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  // Proccess the data in predetermined block sizes with tables for quickly
  // combining the checksum. Experimentally it's better to use larger block
  // sizes where possible so use a hierarchy of decreasing block sizes.
  uint64_t l64 = l;
  while ((e - p) >= kGroups * kBlock0Size) {
    uint64_t l641 = 0;
    uint64_t l642 = 0;
    for (int i = 0; i < kBlock0Size; i += 8 * 8) {
      // Prefetch ahead to hide latency.
      RequestPrefetch(p + kPrefetchHorizon);
      RequestPrefetch(p + kBlock0Size + kPrefetchHorizon);
      RequestPrefetch(p + 2 * kBlock0Size + kPrefetchHorizon);

      // Process 64 bytes at a time.
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
      STEP8X3(l64, l641, l642, kBlock0Size);
    }

    // Combine results.
    SKIP_BLOCK(l64, kBlock0SkipTable);
    l64 ^= l641;
    SKIP_BLOCK(l64, kBlock0SkipTable);
    l64 ^= l642;
    p += (kGroups - 1) * kBlock0Size;
  }
  while ((e - p) >= kGroups * kBlock1Size) {
    uint64_t l641 = 0;
    uint64_t l642 = 0;
    for (int i = 0; i < kBlock1Size; i += 8) {
      STEP8X3(l64, l641, l642, kBlock1Size);
    }
    SKIP_BLOCK(l64, kBlock1SkipTable);
    l64 ^= l641;
    SKIP_BLOCK(l64, kBlock1SkipTable);
    l64 ^= l642;
    p += (kGroups - 1) * kBlock1Size;
  }
  while ((e - p) >= kGroups * kBlock2Size) {
    uint64_t l641 = 0;
    uint64_t l642 = 0;
    for (int i = 0; i < kBlock2Size; i += 8) {
      STEP8X3(l64, l641, l642, kBlock2Size);
    }
    SKIP_BLOCK(l64, kBlock2SkipTable);
    l64 ^= l641;
    SKIP_BLOCK(l64, kBlock2SkipTable);
    l64 ^= l642;
    p += (kGroups - 1) * kBlock2Size;
  }

  // Process bytes 16 at a time
  while ((e - p) >= 16) {
    STEP8(l64, p);
    STEP8(l64, p);
  }

  l = static_cast<uint32_t>(l64);
  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef SKIP_BLOCK
#undef STEP8X3
#undef STEP8BY3
#undef STEP8
#undef STEP4
#undef STEP1

  return l ^ kCRC32Xor;
}